

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

bool __thiscall
cs_impl::any::holder<cs::object_method>::compare(holder<cs::object_method> *this,baseHolder *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*obj->_vptr_baseHolder[2])(obj);
  iVar3 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(extraout_var,iVar2),
                     (type_info *)CONCAT44(extraout_var_00,iVar3));
  return bVar1 && this == (holder<cs::object_method> *)obj;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}